

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void iadst16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  __m256i alVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  
  lVar19 = (long)bit;
  lVar14 = lVar19 * 0x100;
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)(&DAT_004ded48 + lVar19 * 0x20);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dee38 + lVar14);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004ded68 + lVar19 * 0x20);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dee18 + lVar14);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004ded88 + lVar14);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dedf8 + lVar14);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004deda8 + lVar14);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dedd8 + lVar14);
  auVar52._4_4_ = uVar1;
  auVar52._0_4_ = uVar1;
  auVar52._8_4_ = uVar1;
  auVar52._12_4_ = uVar1;
  auVar52._16_4_ = uVar1;
  auVar52._20_4_ = uVar1;
  auVar52._24_4_ = uVar1;
  auVar52._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dedc8 + lVar14);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dedb8 + lVar14);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_004dede8 + lVar14);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  auVar7 = vpmulld_avx2((undefined1  [32])in[0xf],auVar40);
  auVar8 = vpmulld_avx2((undefined1  [32])*in,auVar47);
  auVar7 = vpaddd_avx2(auVar7,auVar21);
  auVar7 = vpaddd_avx2(auVar8,auVar7);
  auVar8 = vpmulld_avx2((undefined1  [32])in[0xf],auVar47);
  auVar40 = vpmulld_avx2(auVar40,(undefined1  [32])*in);
  auVar8 = vpaddd_avx2(auVar8,auVar21);
  auVar47 = vpsubd_avx2(auVar8,auVar40);
  auVar8 = vpmulld_avx2((undefined1  [32])in[0xd],auVar36);
  auVar40 = vpmulld_avx2((undefined1  [32])in[2],auVar44);
  auVar8 = vpaddd_avx2(auVar8,auVar21);
  auVar8 = vpaddd_avx2(auVar8,auVar40);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xd],auVar44);
  auVar36 = vpmulld_avx2(auVar36,(undefined1  [32])in[2]);
  auVar40 = vpaddd_avx2(auVar40,auVar21);
  auVar44 = vpsubd_avx2(auVar40,auVar36);
  auVar40 = vpmulld_avx2((undefined1  [32])in[0xb],auVar26);
  auVar36 = vpmulld_avx2((undefined1  [32])in[4],auVar42);
  auVar40 = vpaddd_avx2(auVar40,auVar21);
  auVar40 = vpaddd_avx2(auVar40,auVar36);
  auVar36 = vpmulld_avx2((undefined1  [32])in[0xb],auVar42);
  auVar26 = vpmulld_avx2(auVar26,(undefined1  [32])in[4]);
  auVar36 = vpaddd_avx2(auVar36,auVar21);
  auVar42 = vpsubd_avx2(auVar36,auVar26);
  auVar36 = vpmulld_avx2((undefined1  [32])in[9],auVar30);
  auVar26 = vpmulld_avx2((undefined1  [32])in[6],auVar52);
  auVar36 = vpaddd_avx2(auVar36,auVar21);
  auVar36 = vpaddd_avx2(auVar36,auVar26);
  uVar1 = *(undefined4 *)(&DAT_004ded98 + lVar14);
  auVar53._4_4_ = uVar1;
  auVar53._0_4_ = uVar1;
  auVar53._8_4_ = uVar1;
  auVar53._12_4_ = uVar1;
  auVar53._16_4_ = uVar1;
  auVar53._20_4_ = uVar1;
  auVar53._24_4_ = uVar1;
  auVar53._28_4_ = uVar1;
  auVar26 = vpmulld_avx2((undefined1  [32])in[9],auVar52);
  auVar30 = vpmulld_avx2(auVar30,(undefined1  [32])in[6]);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar52 = vpsubd_avx2(auVar26,auVar30);
  auVar26 = vpmulld_avx2((undefined1  [32])in[7],auVar38);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar30 = vpmulld_avx2((undefined1  [32])in[8],auVar49);
  auVar26 = vpaddd_avx2(auVar30,auVar26);
  auVar30 = vpmulld_avx2((undefined1  [32])in[7],auVar49);
  auVar38 = vpmulld_avx2(auVar38,(undefined1  [32])in[8]);
  auVar30 = vpaddd_avx2(auVar21,auVar30);
  auVar49 = vpsubd_avx2(auVar30,auVar38);
  auVar30 = vpmulld_avx2((undefined1  [32])in[5],auVar28);
  auVar30 = vpaddd_avx2(auVar21,auVar30);
  auVar38 = vpmulld_avx2((undefined1  [32])in[10],auVar53);
  auVar30 = vpaddd_avx2(auVar38,auVar30);
  auVar38 = vpmulld_avx2((undefined1  [32])in[5],auVar53);
  uVar1 = *(undefined4 *)(&DAT_004dee08 + lVar14);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  auVar28 = vpmulld_avx2(auVar28,(undefined1  [32])in[10]);
  auVar38 = vpaddd_avx2(auVar21,auVar38);
  auVar53 = vpsubd_avx2(auVar38,auVar28);
  auVar38 = vpmulld_avx2((undefined1  [32])in[3],auVar33);
  auVar38 = vpaddd_avx2(auVar21,auVar38);
  uVar1 = *(undefined4 *)(&DAT_004ded78 + lVar14);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  auVar28 = vpmulld_avx2((undefined1  [32])in[0xc],auVar50);
  auVar38 = vpaddd_avx2(auVar38,auVar28);
  auVar28 = vpmulld_avx2((undefined1  [32])in[3],auVar50);
  auVar33 = vpmulld_avx2(auVar33,(undefined1  [32])in[0xc]);
  auVar28 = vpaddd_avx2(auVar21,auVar28);
  auVar50 = vpsubd_avx2(auVar28,auVar33);
  uVar1 = *(undefined4 *)(&DAT_004dee28 + lVar14);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  auVar28 = vpmulld_avx2((undefined1  [32])in[1],auVar31);
  auVar28 = vpaddd_avx2(auVar21,auVar28);
  uVar1 = *(undefined4 *)(&DAT_004ded58 + lVar19 * 0x20);
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar51._16_4_ = uVar1;
  auVar51._20_4_ = uVar1;
  auVar51._24_4_ = uVar1;
  auVar51._28_4_ = uVar1;
  auVar33 = vpmulld_avx2((undefined1  [32])in[0xe],auVar51);
  auVar28 = vpaddd_avx2(auVar33,auVar28);
  auVar33 = vpmulld_avx2((undefined1  [32])in[1],auVar51);
  auVar31 = vpmulld_avx2(auVar31,(undefined1  [32])in[0xe]);
  auVar33 = vpaddd_avx2(auVar21,auVar33);
  auVar51 = vpsubd_avx2(auVar33,auVar31);
  auVar33 = vpsrad_avx2(auVar7,ZEXT416((uint)bit));
  auVar26 = vpsrad_avx2(auVar26,ZEXT416((uint)bit));
  auVar7 = vpaddd_avx2(auVar26,auVar33);
  auVar23 = vpsubd_avx2(auVar33,auVar26);
  auVar27 = ZEXT416((uint)bit);
  auVar33 = vpsrad_avx2(auVar47,auVar27);
  auVar31 = vpsrad_avx2(auVar49,auVar27);
  auVar26 = vpaddd_avx2(auVar31,auVar33);
  auVar47 = vpsubd_avx2(auVar33,auVar31);
  auVar33 = vpsrad_avx2(auVar8,auVar27);
  auVar30 = vpsrad_avx2(auVar30,auVar27);
  auVar8 = vpaddd_avx2(auVar30,auVar33);
  auVar49 = vpsubd_avx2(auVar33,auVar30);
  auVar27 = ZEXT416((uint)bit);
  auVar33 = vpsrad_avx2(auVar44,auVar27);
  auVar31 = vpsrad_avx2(auVar53,auVar27);
  auVar30 = vpaddd_avx2(auVar31,auVar33);
  auVar44 = vpsubd_avx2(auVar33,auVar31);
  auVar33 = vpsrad_avx2(auVar40,auVar27);
  auVar38 = vpsrad_avx2(auVar38,auVar27);
  auVar40 = vpaddd_avx2(auVar38,auVar33);
  auVar53 = vpsubd_avx2(auVar33,auVar38);
  auVar33 = vpsrad_avx2(auVar42,auVar27);
  auVar31 = vpsrad_avx2(auVar50,auVar27);
  auVar38 = vpaddd_avx2(auVar31,auVar33);
  auVar42 = vpsubd_avx2(auVar33,auVar31);
  auVar33 = vpsrad_avx2(auVar36,auVar27);
  auVar28 = vpsrad_avx2(auVar28,auVar27);
  auVar36 = vpaddd_avx2(auVar28,auVar33);
  auVar50 = vpsubd_avx2(auVar33,auVar28);
  auVar27 = ZEXT416((uint)bit);
  auVar33 = vpsrad_avx2(auVar52,auVar27);
  auVar31 = vpsrad_avx2(auVar51,auVar27);
  auVar28 = vpaddd_avx2(auVar31,auVar33);
  auVar33 = vpsubd_avx2(auVar33,auVar31);
  iVar15 = *(int *)(&DAT_004dee20 + lVar14);
  iVar17 = -iVar15;
  iVar13 = *(int *)(&DAT_004deda0 + lVar14);
  iVar2 = *(int *)(&DAT_004dee00 + lVar14);
  iVar16 = -iVar13;
  iVar18 = -iVar2;
  iVar20 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar12 = 0x8000;
  if (0xf < iVar20) {
    iVar12 = 1 << ((char)iVar20 - 1U & 0x1f);
  }
  iVar20 = -iVar12;
  iVar12 = iVar12 + -1;
  auVar22._4_4_ = iVar15;
  auVar22._0_4_ = iVar15;
  auVar22._8_4_ = iVar15;
  auVar22._12_4_ = iVar15;
  auVar22._16_4_ = iVar15;
  auVar22._20_4_ = iVar15;
  auVar22._24_4_ = iVar15;
  auVar22._28_4_ = iVar15;
  auVar34._4_4_ = iVar20;
  auVar34._0_4_ = iVar20;
  auVar34._8_4_ = iVar20;
  auVar34._12_4_ = iVar20;
  auVar34._16_4_ = iVar20;
  auVar34._20_4_ = iVar20;
  auVar34._24_4_ = iVar20;
  auVar34._28_4_ = iVar20;
  auVar32._4_4_ = iVar12;
  auVar32._0_4_ = iVar12;
  auVar32._8_4_ = iVar12;
  auVar32._12_4_ = iVar12;
  auVar32._16_4_ = iVar12;
  auVar32._20_4_ = iVar12;
  auVar32._24_4_ = iVar12;
  auVar32._28_4_ = iVar12;
  auVar31 = vpmaxsd_avx2(auVar23,auVar34);
  auVar52 = vpminsd_avx2(auVar31,auVar32);
  auVar31 = vpmaxsd_avx2(auVar47,auVar34);
  auVar47 = vpminsd_avx2(auVar31,auVar32);
  uVar1 = *(undefined4 *)(&DAT_004ded60 + lVar19 * 0x20);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar31 = vpmulld_avx2(auVar52,auVar43);
  auVar31 = vpaddd_avx2(auVar31,auVar21);
  auVar51 = vpmulld_avx2(auVar47,auVar22);
  auVar31 = vpaddd_avx2(auVar31,auVar51);
  auVar52 = vpmulld_avx2(auVar52,auVar22);
  auVar51 = vpmulld_avx2(auVar43,auVar47);
  auVar47 = vpaddd_avx2(auVar21,auVar52);
  auVar51 = vpsubd_avx2(auVar47,auVar51);
  auVar23._4_4_ = iVar13;
  auVar23._0_4_ = iVar13;
  auVar23._8_4_ = iVar13;
  auVar23._12_4_ = iVar13;
  auVar23._16_4_ = iVar13;
  auVar23._20_4_ = iVar13;
  auVar23._24_4_ = iVar13;
  auVar23._28_4_ = iVar13;
  auVar47 = vpmaxsd_avx2(auVar49,auVar34);
  auVar52 = vpminsd_avx2(auVar47,auVar32);
  auVar47 = vpmaxsd_avx2(auVar44,auVar34);
  auVar44 = vpminsd_avx2(auVar47,auVar32);
  uVar1 = *(undefined4 *)(&DAT_004dede0 + lVar14);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  auVar47 = vpmulld_avx2(auVar52,auVar45);
  auVar47 = vpaddd_avx2(auVar47,auVar21);
  auVar49 = vpmulld_avx2(auVar44,auVar23);
  auVar47 = vpaddd_avx2(auVar47,auVar49);
  auVar52 = vpmulld_avx2(auVar52,auVar23);
  auVar49 = vpmulld_avx2(auVar45,auVar44);
  auVar44 = vpaddd_avx2(auVar21,auVar52);
  auVar23 = vpsubd_avx2(auVar44,auVar49);
  auVar24._4_4_ = iVar17;
  auVar24._0_4_ = iVar17;
  auVar24._8_4_ = iVar17;
  auVar24._12_4_ = iVar17;
  auVar24._16_4_ = iVar17;
  auVar24._20_4_ = iVar17;
  auVar24._24_4_ = iVar17;
  auVar24._28_4_ = iVar17;
  auVar44 = vpmaxsd_avx2(auVar53,auVar34);
  auVar52 = vpminsd_avx2(auVar44,auVar32);
  auVar44 = vpmaxsd_avx2(auVar42,auVar34);
  auVar42 = vpminsd_avx2(auVar44,auVar32);
  auVar44 = vpmulld_avx2(auVar52,auVar24);
  auVar44 = vpaddd_avx2(auVar21,auVar44);
  auVar49 = vpmulld_avx2(auVar42,auVar43);
  auVar44 = vpaddd_avx2(auVar49,auVar44);
  auVar52 = vpmulld_avx2(auVar52,auVar43);
  auVar49 = vpmulld_avx2(auVar24,auVar42);
  auVar42 = vpaddd_avx2(auVar21,auVar52);
  auVar53 = vpsubd_avx2(auVar42,auVar49);
  auVar25._4_4_ = iVar16;
  auVar25._0_4_ = iVar16;
  auVar25._8_4_ = iVar16;
  auVar25._12_4_ = iVar16;
  auVar25._16_4_ = iVar16;
  auVar25._20_4_ = iVar16;
  auVar25._24_4_ = iVar16;
  auVar25._28_4_ = iVar16;
  auVar42 = vpmaxsd_avx2(auVar34,auVar50);
  auVar42 = vpminsd_avx2(auVar42,auVar32);
  auVar33 = vpmaxsd_avx2(auVar33,auVar34);
  auVar52 = vpminsd_avx2(auVar33,auVar32);
  auVar33 = vpmulld_avx2(auVar42,auVar25);
  auVar33 = vpaddd_avx2(auVar21,auVar33);
  auVar49 = vpmulld_avx2(auVar52,auVar45);
  auVar33 = vpaddd_avx2(auVar49,auVar33);
  auVar42 = vpmulld_avx2(auVar42,auVar45);
  auVar52 = vpmulld_avx2(auVar25,auVar52);
  auVar42 = vpaddd_avx2(auVar21,auVar42);
  auVar52 = vpsubd_avx2(auVar42,auVar52);
  auVar7 = vpmaxsd_avx2(auVar34,auVar7);
  auVar42 = vpminsd_avx2(auVar7,auVar32);
  auVar7 = vpmaxsd_avx2(auVar34,auVar40);
  auVar40 = vpminsd_avx2(auVar7,auVar32);
  auVar7 = vpaddd_avx2(auVar40,auVar42);
  auVar42 = vpsubd_avx2(auVar42,auVar40);
  auVar40 = vpmaxsd_avx2(auVar34,auVar26);
  auVar26 = vpminsd_avx2(auVar40,auVar32);
  auVar40 = vpmaxsd_avx2(auVar34,auVar38);
  auVar38 = vpminsd_avx2(auVar40,auVar32);
  auVar40 = vpaddd_avx2(auVar38,auVar26);
  auVar49 = vpsubd_avx2(auVar26,auVar38);
  auVar8 = vpmaxsd_avx2(auVar34,auVar8);
  auVar26 = vpminsd_avx2(auVar8,auVar32);
  auVar8 = vpmaxsd_avx2(auVar34,auVar36);
  auVar36 = vpminsd_avx2(auVar8,auVar32);
  auVar8 = vpaddd_avx2(auVar36,auVar26);
  auVar50 = vpsubd_avx2(auVar26,auVar36);
  auVar36 = vpmaxsd_avx2(auVar34,auVar30);
  auVar26 = vpminsd_avx2(auVar36,auVar32);
  auVar36 = vpmaxsd_avx2(auVar34,auVar28);
  auVar30 = vpminsd_avx2(auVar36,auVar32);
  auVar36 = vpaddd_avx2(auVar30,auVar26);
  auVar22 = vpsubd_avx2(auVar26,auVar30);
  auVar30 = vpsrad_avx2(auVar31,auVar27);
  auVar38 = vpsrad_avx2(auVar44,auVar27);
  auVar26 = vpaddd_avx2(auVar38,auVar30);
  auVar24 = vpsubd_avx2(auVar30,auVar38);
  auVar38 = vpsrad_avx2(auVar51,auVar27);
  auVar28 = vpsrad_avx2(auVar53,auVar27);
  auVar30 = vpaddd_avx2(auVar28,auVar38);
  auVar53 = vpsubd_avx2(auVar38,auVar28);
  auVar28 = vpsrad_avx2(auVar47,auVar27);
  auVar33 = vpsrad_avx2(auVar33,auVar27);
  auVar38 = vpaddd_avx2(auVar33,auVar28);
  auVar51 = vpsubd_avx2(auVar28,auVar33);
  auVar33 = vpsrad_avx2(auVar23,auVar27);
  auVar31 = vpsrad_avx2(auVar52,auVar27);
  auVar28 = vpaddd_avx2(auVar31,auVar33);
  auVar23 = vpsubd_avx2(auVar33,auVar31);
  auVar39._4_4_ = iVar2;
  auVar39._0_4_ = iVar2;
  auVar39._8_4_ = iVar2;
  auVar39._12_4_ = iVar2;
  auVar39._16_4_ = iVar2;
  auVar39._20_4_ = iVar2;
  auVar39._24_4_ = iVar2;
  auVar39._28_4_ = iVar2;
  auVar33 = vpmaxsd_avx2(auVar42,auVar34);
  auVar31 = vpminsd_avx2(auVar33,auVar32);
  auVar33 = vpmaxsd_avx2(auVar49,auVar34);
  auVar47 = vpminsd_avx2(auVar33,auVar32);
  uVar1 = *(undefined4 *)(&DAT_004ded80 + lVar14);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  auVar33 = vpmulld_avx2(auVar31,auVar46);
  auVar33 = vpaddd_avx2(auVar21,auVar33);
  auVar44 = vpmulld_avx2(auVar47,auVar39);
  auVar33 = vpaddd_avx2(auVar44,auVar33);
  auVar31 = vpmulld_avx2(auVar31,auVar39);
  auVar47 = vpmulld_avx2(auVar46,auVar47);
  auVar31 = vpaddd_avx2(auVar21,auVar31);
  auVar25 = vpsubd_avx2(auVar31,auVar47);
  auVar41._4_4_ = iVar18;
  auVar41._0_4_ = iVar18;
  auVar41._8_4_ = iVar18;
  auVar41._12_4_ = iVar18;
  auVar41._16_4_ = iVar18;
  auVar41._20_4_ = iVar18;
  auVar41._24_4_ = iVar18;
  auVar41._28_4_ = iVar18;
  auVar31 = vpmaxsd_avx2(auVar34,auVar50);
  auVar47 = vpminsd_avx2(auVar31,auVar32);
  auVar31 = vpmaxsd_avx2(auVar22,auVar34);
  auVar44 = vpminsd_avx2(auVar31,auVar32);
  auVar31 = vpmulld_avx2(auVar47,auVar41);
  auVar31 = vpaddd_avx2(auVar21,auVar31);
  auVar42 = vpmulld_avx2(auVar44,auVar46);
  auVar31 = vpaddd_avx2(auVar42,auVar31);
  auVar47 = vpmulld_avx2(auVar47,auVar46);
  auVar44 = vpmulld_avx2(auVar41,auVar44);
  auVar47 = vpaddd_avx2(auVar21,auVar47);
  auVar50 = vpsubd_avx2(auVar47,auVar44);
  auVar47 = vpmaxsd_avx2(auVar24,auVar34);
  auVar44 = vpminsd_avx2(auVar47,auVar32);
  auVar47 = vpmaxsd_avx2(auVar53,auVar34);
  auVar42 = vpminsd_avx2(auVar47,auVar32);
  auVar47 = vpmulld_avx2(auVar44,auVar46);
  auVar47 = vpaddd_avx2(auVar47,auVar21);
  auVar52 = vpmulld_avx2(auVar42,auVar39);
  auVar47 = vpaddd_avx2(auVar47,auVar52);
  auVar44 = vpmulld_avx2(auVar44,auVar39);
  auVar42 = vpmulld_avx2(auVar46,auVar42);
  auVar44 = vpaddd_avx2(auVar21,auVar44);
  auVar53 = vpsubd_avx2(auVar44,auVar42);
  auVar44 = vpmaxsd_avx2(auVar51,auVar34);
  auVar42 = vpminsd_avx2(auVar44,auVar32);
  auVar44 = vpmaxsd_avx2(auVar23,auVar34);
  auVar52 = vpminsd_avx2(auVar44,auVar32);
  auVar44 = vpmulld_avx2(auVar42,auVar41);
  auVar44 = vpaddd_avx2(auVar21,auVar44);
  auVar49 = vpmulld_avx2(auVar52,auVar46);
  auVar44 = vpaddd_avx2(auVar49,auVar44);
  auVar42 = vpmulld_avx2(auVar42,auVar46);
  auVar52 = vpmulld_avx2(auVar41,auVar52);
  auVar42 = vpaddd_avx2(auVar21,auVar42);
  auVar52 = vpsubd_avx2(auVar42,auVar52);
  auVar7 = vpmaxsd_avx2(auVar34,auVar7);
  auVar42 = vpminsd_avx2(auVar7,auVar32);
  auVar7 = vpmaxsd_avx2(auVar34,auVar8);
  auVar8 = vpminsd_avx2(auVar7,auVar32);
  auVar7 = vpaddd_avx2(auVar8,auVar42);
  auVar42 = vpsubd_avx2(auVar42,auVar8);
  auVar8 = vpmaxsd_avx2(auVar34,auVar40);
  auVar40 = vpminsd_avx2(auVar8,auVar32);
  auVar8 = vpmaxsd_avx2(auVar34,auVar36);
  auVar36 = vpminsd_avx2(auVar8,auVar32);
  auVar8 = vpaddd_avx2(auVar36,auVar40);
  auVar49 = vpsubd_avx2(auVar40,auVar36);
  auVar36 = vpsrad_avx2(auVar33,auVar27);
  auVar33 = vpsrad_avx2(auVar31,auVar27);
  auVar40 = vpaddd_avx2(auVar33,auVar36);
  auVar51 = vpsubd_avx2(auVar36,auVar33);
  auVar33 = vpsrad_avx2(auVar25,auVar27);
  auVar31 = vpsrad_avx2(auVar50,auVar27);
  auVar36 = vpaddd_avx2(auVar31,auVar33);
  auVar50 = vpsubd_avx2(auVar33,auVar31);
  auVar26 = vpmaxsd_avx2(auVar34,auVar26);
  auVar33 = vpminsd_avx2(auVar26,auVar32);
  auVar26 = vpmaxsd_avx2(auVar34,auVar38);
  auVar38 = vpminsd_avx2(auVar26,auVar32);
  auVar26 = vpaddd_avx2(auVar38,auVar33);
  auVar23 = vpsubd_avx2(auVar33,auVar38);
  auVar30 = vpmaxsd_avx2(auVar34,auVar30);
  auVar38 = vpminsd_avx2(auVar30,auVar32);
  auVar30 = vpmaxsd_avx2(auVar34,auVar28);
  auVar28 = vpminsd_avx2(auVar30,auVar32);
  auVar30 = vpaddd_avx2(auVar28,auVar38);
  auVar22 = vpsubd_avx2(auVar38,auVar28);
  auVar28 = vpsrad_avx2(auVar47,auVar27);
  auVar33 = vpsrad_avx2(auVar44,auVar27);
  auVar38 = vpaddd_avx2(auVar33,auVar28);
  auVar24 = vpsubd_avx2(auVar28,auVar33);
  auVar27 = ZEXT416((uint)bit);
  auVar33 = vpsrad_avx2(auVar53,auVar27);
  auVar31 = vpsrad_avx2(auVar52,auVar27);
  auVar28 = vpaddd_avx2(auVar33,auVar31);
  auVar53 = vpsubd_avx2(auVar33,auVar31);
  auVar7 = vpmaxsd_avx2(auVar7,auVar34);
  auVar33 = vpmaxsd_avx2(auVar42,auVar34);
  auVar8 = vpmaxsd_avx2(auVar8,auVar34);
  auVar31 = vpmaxsd_avx2(auVar49,auVar34);
  auVar40 = vpmaxsd_avx2(auVar40,auVar34);
  auVar47 = vpmaxsd_avx2(auVar34,auVar51);
  auVar36 = vpmaxsd_avx2(auVar36,auVar34);
  auVar44 = vpmaxsd_avx2(auVar34,auVar50);
  auVar26 = vpmaxsd_avx2(auVar34,auVar26);
  auVar42 = vpmaxsd_avx2(auVar34,auVar23);
  auVar30 = vpmaxsd_avx2(auVar34,auVar30);
  auVar52 = vpmaxsd_avx2(auVar34,auVar22);
  auVar38 = vpmaxsd_avx2(auVar34,auVar38);
  auVar49 = vpmaxsd_avx2(auVar34,auVar24);
  auVar28 = vpmaxsd_avx2(auVar28,auVar34);
  auVar53 = vpmaxsd_avx2(auVar34,auVar53);
  alVar3 = (__m256i)vpminsd_avx2(auVar7,auVar32);
  auVar7 = vpminsd_avx2(auVar33,auVar32);
  auVar33 = vpminsd_avx2(auVar8,auVar32);
  auVar8 = vpminsd_avx2(auVar31,auVar32);
  auVar31 = vpminsd_avx2(auVar40,auVar32);
  auVar40 = vpminsd_avx2(auVar47,auVar32);
  alVar4 = (__m256i)vpminsd_avx2(auVar36,auVar32);
  auVar36 = vpminsd_avx2(auVar44,auVar32);
  auVar47 = vpminsd_avx2(auVar26,auVar32);
  auVar26 = vpminsd_avx2(auVar42,auVar32);
  alVar5 = (__m256i)vpminsd_avx2(auVar32,auVar30);
  auVar30 = vpminsd_avx2(auVar32,auVar52);
  alVar6 = (__m256i)vpminsd_avx2(auVar32,auVar38);
  auVar38 = vpminsd_avx2(auVar32,auVar49);
  auVar28 = vpminsd_avx2(auVar28,auVar32);
  auVar44 = vpminsd_avx2(auVar53,auVar32);
  uVar1 = *(undefined4 *)(&DAT_004dedc0 + lVar14);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar7 = vpmulld_avx2(auVar7,auVar35);
  auVar42 = vpmulld_avx2(auVar8,auVar35);
  auVar7 = vpaddd_avx2(auVar21,auVar7);
  auVar8 = vpaddd_avx2(auVar7,auVar42);
  auVar42 = vpsubd_avx2(auVar7,auVar42);
  auVar7 = vpmulld_avx2(auVar40,auVar35);
  auVar36 = vpmulld_avx2(auVar36,auVar35);
  auVar7 = vpaddd_avx2(auVar21,auVar7);
  auVar40 = vpaddd_avx2(auVar36,auVar7);
  auVar52 = vpsubd_avx2(auVar7,auVar36);
  auVar7 = vpmulld_avx2(auVar26,auVar35);
  auVar26 = vpmulld_avx2(auVar30,auVar35);
  auVar7 = vpaddd_avx2(auVar7,auVar21);
  auVar36 = vpaddd_avx2(auVar7,auVar26);
  auVar49 = vpsubd_avx2(auVar7,auVar26);
  auVar7 = vpmulld_avx2(auVar38,auVar35);
  auVar30 = vpmulld_avx2(auVar44,auVar35);
  auVar7 = vpaddd_avx2(auVar7,auVar21);
  auVar26 = vpaddd_avx2(auVar7,auVar30);
  auVar30 = vpsubd_avx2(auVar7,auVar30);
  auVar7 = vpsrad_avx2(auVar8,auVar27);
  alVar9 = (__m256i)vpsrad_avx2(auVar42,auVar27);
  alVar10 = (__m256i)vpsrad_avx2(auVar40,auVar27);
  auVar8 = vpsrad_avx2(auVar52,auVar27);
  alVar11 = (__m256i)vpsrad_avx2(auVar36,auVar27);
  auVar40 = vpsrad_avx2(auVar49,auVar27);
  auVar36 = vpsrad_avx2(auVar26,auVar27);
  alVar37 = (__m256i)vpsrad_avx2(auVar30,auVar27);
  if (do_cols == 0) {
    iVar15 = 10;
    if (10 < bd) {
      iVar15 = bd;
    }
    iVar15 = 0x20 << ((byte)iVar15 & 0x1f);
    iVar13 = -iVar15;
    auVar29._4_4_ = iVar13;
    auVar29._0_4_ = iVar13;
    auVar29._8_4_ = iVar13;
    auVar29._12_4_ = iVar13;
    auVar29._16_4_ = iVar13;
    auVar29._20_4_ = iVar13;
    auVar29._24_4_ = iVar13;
    auVar29._28_4_ = iVar13;
    iVar15 = iVar15 + -1;
    iVar13 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar54._4_4_ = iVar13;
    auVar54._0_4_ = iVar13;
    auVar54._8_4_ = iVar13;
    auVar54._12_4_ = iVar13;
    auVar54._16_4_ = iVar13;
    auVar54._20_4_ = iVar13;
    auVar54._24_4_ = iVar13;
    auVar54._28_4_ = iVar13;
    auVar26 = vpaddd_avx2(auVar54,(undefined1  [32])alVar3);
    auVar26 = vpsrad_avx2(auVar26,ZEXT416((uint)out_shift));
    auVar48._4_4_ = iVar15;
    auVar48._0_4_ = iVar15;
    auVar48._8_4_ = iVar15;
    auVar48._12_4_ = iVar15;
    auVar48._16_4_ = iVar15;
    auVar48._20_4_ = iVar15;
    auVar48._24_4_ = iVar15;
    auVar48._28_4_ = iVar15;
    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    *out = alVar3;
    auVar26 = vpsubd_avx2(auVar54,auVar47);
    auVar26 = vpsrad_avx2(auVar26,ZEXT416((uint)out_shift));
    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    auVar26 = vpaddd_avx2((undefined1  [32])alVar6,auVar54);
    auVar27 = ZEXT416((uint)out_shift);
    auVar26 = vpsrad_avx2(auVar26,auVar27);
    out[1] = alVar3;
    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    out[2] = alVar3;
    auVar26 = vpsubd_avx2(auVar54,auVar31);
    auVar26 = vpsrad_avx2(auVar26,auVar27);
    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    auVar26 = vpaddd_avx2(auVar54,(undefined1  [32])alVar10);
    auVar26 = vpsrad_avx2(auVar26,auVar27);
    out[3] = alVar3;
    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    out[4] = alVar3;
    auVar36 = vpsubd_avx2(auVar54,auVar36);
    auVar36 = vpsrad_avx2(auVar36,auVar27);
    auVar36 = vpmaxsd_avx2(auVar36,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar36,auVar48);
    auVar36 = vpaddd_avx2((undefined1  [32])alVar11,auVar54);
    auVar27 = ZEXT416((uint)out_shift);
    auVar36 = vpsrad_avx2(auVar36,auVar27);
    out[5] = alVar3;
    auVar36 = vpmaxsd_avx2(auVar36,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar36,auVar48);
    out[6] = alVar3;
    auVar7 = vpsubd_avx2(auVar54,auVar7);
    auVar7 = vpsrad_avx2(auVar7,auVar27);
    auVar7 = vpmaxsd_avx2(auVar7,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar7,auVar48);
    auVar7 = vpaddd_avx2((undefined1  [32])alVar9,auVar54);
    auVar7 = vpsrad_avx2(auVar7,auVar27);
    out[7] = alVar3;
    auVar7 = vpmaxsd_avx2(auVar7,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar7,auVar48);
    out[8] = alVar3;
    auVar7 = vpsubd_avx2(auVar54,auVar40);
    auVar7 = vpsrad_avx2(auVar7,auVar27);
    auVar7 = vpmaxsd_avx2(auVar7,auVar29);
    alVar3 = (__m256i)vpminsd_avx2(auVar7,auVar48);
    out[9] = alVar3;
    auVar7 = vpaddd_avx2(auVar54,(undefined1  [32])alVar37);
    auVar36 = vpsubd_avx2(auVar54,auVar8);
    auVar8 = vpaddd_avx2(auVar54,(undefined1  [32])alVar4);
    auVar30 = vpsubd_avx2(auVar54,auVar28);
    auVar40 = vpaddd_avx2(auVar54,(undefined1  [32])alVar5);
    auVar28 = vpsubd_avx2(auVar54,auVar33);
    auVar7 = vpsrad_avx2(auVar7,auVar27);
    auVar36 = vpsrad_avx2(auVar36,auVar27);
    auVar26 = vpsrad_avx2(auVar8,auVar27);
    auVar30 = vpsrad_avx2(auVar30,auVar27);
    auVar38 = vpsrad_avx2(auVar40,ZEXT416((uint)out_shift));
    auVar28 = vpsrad_avx2(auVar28,ZEXT416((uint)out_shift));
    auVar7 = vpmaxsd_avx2(auVar7,auVar29);
    auVar8 = vpmaxsd_avx2(auVar36,auVar29);
    auVar40 = vpmaxsd_avx2(auVar26,auVar29);
    auVar36 = vpmaxsd_avx2(auVar30,auVar29);
    auVar26 = vpmaxsd_avx2(auVar38,auVar29);
    auVar30 = vpmaxsd_avx2(auVar28,auVar29);
    alVar37 = (__m256i)vpminsd_avx2(auVar7,auVar48);
    alVar3 = (__m256i)vpminsd_avx2(auVar8,auVar48);
    alVar4 = (__m256i)vpminsd_avx2(auVar40,auVar48);
    alVar6 = (__m256i)vpminsd_avx2(auVar36,auVar48);
    alVar5 = (__m256i)vpminsd_avx2(auVar26,auVar48);
    alVar9 = (__m256i)vpminsd_avx2(auVar30,auVar48);
  }
  else {
    *out = alVar3;
    auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar47);
    out[1] = alVar3;
    out[2] = alVar6;
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar31);
    out[3] = alVar3;
    out[4] = alVar10;
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar36);
    out[5] = alVar3;
    out[6] = alVar11;
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar7);
    out[7] = alVar3;
    out[8] = alVar9;
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar40);
    out[9] = alVar3;
    alVar3 = (__m256i)vpsubd_avx2(auVar26,auVar8);
    alVar6 = (__m256i)vpsubd_avx2(auVar26,auVar28);
    alVar9 = (__m256i)vpsubd_avx2(auVar26,auVar33);
  }
  out[10] = alVar37;
  out[0xb] = alVar3;
  out[0xc] = alVar4;
  out[0xd] = alVar6;
  out[0xe] = alVar5;
  out[0xf] = alVar9;
  return;
}

Assistant:

static void iadst16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[15];
  x1[1] = input[0];
  x1[2] = input[13];
  x1[3] = input[2];
  x1[4] = input[11];
  x1[5] = input[4];
  x1[6] = input[9];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[9] = input[8];
  x1[10] = input[5];
  x1[11] = input[10];
  x1[12] = input[3];
  x1[13] = input[12];
  x1[14] = input[1];
  x1[15] = input[14];

  // stage 2
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r,
                  INV_COS_BIT);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}